

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk * hard_centre_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  loc to_avoid;
  ulong uVar2;
  wchar_t w;
  char **ppcVar3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  vault *v;
  chunk *c;
  loc_conflict lVar9;
  chunk *pcVar10;
  chunk *c_00;
  chunk *c_01;
  chunk *pcVar11;
  loc_conflict lVar12;
  int *colors;
  int *counts;
  int iVar13;
  wchar_t wVar14;
  int iVar15;
  wchar_t wVar16;
  int iVar17;
  char *pcVar18;
  size_t len;
  long lVar19;
  loc_conflict grid;
  wchar_t color_of_floor [4];
  loc_conflict floor [4];
  loc local_e0;
  chunk *local_d8;
  char **local_d0;
  wchar_t local_c8 [6];
  loc_conflict local_b0;
  chunk *local_a8;
  chunk *local_a0;
  wchar_t local_98;
  wchar_t local_94;
  wchar_t local_90;
  wchar_t local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  loc_conflict local_70;
  chunk *local_68;
  ulong local_60;
  loc local_58 [5];
  
  uVar6 = Rand_div(2);
  pcVar18 = "Greater vault";
  if (uVar6 == 0) {
    pcVar18 = "Greater vault (new)";
  }
  v = random_vault((int)p->depth,pcVar18,pcVar18);
  c = (chunk *)cave_new((uint)v->hgt,(uint)v->wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  fill_rectangle(c,L'\0',L'\0',(uint)v->hgt + L'\xffffffff',(uint)v->wid + L'\xffffffff',
                 FEAT_GRANITE,L'\0');
  dun->cent_n = L'\0';
  reset_entrance_data(c);
  event_signal_string(EVENT_GEN_ROOM_START,pcVar18);
  lVar9 = loc((uint)(v->wid >> 1),(uint)(v->hgt >> 1));
  _Var4 = build_vault(c,lVar9,v);
  event_signal_flag(EVENT_GEN_ROOM_END,_Var4);
  if (!_Var4) {
    uncreate_artifacts((chunk_conflict *)c);
    cave_free((chunk_conflict *)c);
    c = (chunk *)0x0;
  }
  if (dun->persist == true) {
    uncreate_artifacts((chunk_conflict *)c);
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "no hard centre levels in persistent dungeons";
  }
  else {
    local_d0 = p_error;
    if (*dun->ent_n < 1) {
      wVar14 = L'\x01';
    }
    else {
      uVar6 = Rand_div(3);
      wVar14 = uVar6 + L'\x02';
    }
    dun->wall_n = L'\0';
    if (L'\0' < wVar14) {
      wVar7 = L'\0';
      do {
        if (*dun->ent_n == 0) {
          _Var4 = cave_find((chunk_conflict *)c,(loc_conflict *)&local_e0,square_iswall_outer);
          if (!_Var4) {
            if (wVar7 == L'\0') {
              uncreate_artifacts((chunk_conflict *)c);
              wipe_mon_list(c,p);
              cave_free((chunk_conflict *)c);
              pcVar18 = "no SQUARE_WALL_OUTER grid for an entrance to the centre vault";
              goto LAB_0014d9fa;
            }
            break;
          }
        }
        else {
          local_e0 = (loc)choose_random_entrance
                                    (c,L'\0',(loc_conflict *)0x0,L'\0',(loc_conflict *)dun->wall,
                                     wVar7);
          lVar9 = loc(0,0);
          _Var4 = loc_eq((loc_conflict)local_e0,lVar9);
          if (_Var4) {
            if (wVar7 == L'\0') {
              uncreate_artifacts((chunk_conflict *)c);
              wipe_mon_list(c,p);
              cave_free((chunk_conflict *)c);
              pcVar18 = "random selection of entrance to the centre vault failed";
              goto LAB_0014d9fa;
            }
            break;
          }
        }
        pierce_outer_wall(c,(loc_conflict)local_e0);
        square_set_feat((chunk_conflict *)c,local_e0,FEAT_FLOOR);
        wVar7 = wVar7 + L'\x01';
      } while (wVar14 != wVar7);
    }
    wVar14 = c->height;
    wVar7 = c->width;
    local_94 = wVar7;
    if (wVar14 < wVar7) {
      local_94 = wVar14;
    }
    local_d8 = (chunk *)CONCAT44(local_d8._4_4_,wVar14);
    w = wVar7;
    if (wVar7 < wVar14) {
      w = wVar14;
    }
    wVar16 = ((uint)z_info->dungeon_hgt - local_94) / 2;
    local_78 = (ulong)(uint)wVar16;
    local_94 = local_94 + wVar16;
    wVar14 = (uint)z_info->dungeon_hgt - local_94;
    pcVar10 = cavern_chunk(p,wVar16,w,(connector *)0x0);
    local_8c = wVar14;
    local_a0 = cavern_chunk(p,wVar14,w,(connector *)0x0);
    wVar14 = ((uint)z_info->dungeon_wid - w) / 2;
    local_80 = (ulong)(uint)wVar14;
    local_88 = (ulong)(uint)(wVar14 + w);
    wVar16 = (uint)z_info->dungeon_wid - (wVar14 + w);
    local_60 = (ulong)(uint)w;
    c_00 = cavern_chunk(p,(uint)z_info->dungeon_hgt,wVar14,(connector *)0x0);
    local_90 = wVar16;
    c_01 = cavern_chunk(p,(uint)z_info->dungeon_hgt,wVar16,(connector *)0x0);
    pcVar11 = local_a0;
    local_a8 = pcVar10;
    if ((((pcVar10 == (chunk *)0x0) || (local_a0 == (chunk *)0x0)) || (c_00 == (chunk *)0x0)) ||
       (c_01 == (chunk *)0x0)) {
      if (c_01 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c_01);
        cave_free((chunk_conflict *)c_01);
      }
      pcVar10 = local_a8;
      if (c_00 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
      }
      ppcVar3 = local_d0;
      if (pcVar11 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)pcVar11);
        cave_free((chunk_conflict *)pcVar11);
      }
      if (pcVar10 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)pcVar10);
        cave_free((chunk_conflict *)pcVar10);
      }
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      *ppcVar3 = "could not create one or more of the surrounding caverns";
    }
    else {
      local_98 = (wchar_t)(wVar7 < (wchar_t)local_d8);
      pcVar11 = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
      pcVar11->depth = (int)p->depth;
      pcVar11->place = (int)p->place;
      lVar19 = 0;
      local_68 = c_00;
      chunk_copy((chunk_conflict *)pcVar11,p,(chunk_conflict *)c_00,L'\0',L'\0',L'\0',false);
      local_b0 = loc(0,0);
      wVar14 = (wchar_t)local_80;
      local_d8 = c_01;
      lVar9 = loc(wVar14 + L'\xffffffff',z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)pcVar11,(loc_conflict *)&local_e0,local_b0,lVar9);
      local_58[0] = local_e0;
      chunk_copy((chunk_conflict *)pcVar11,p,(chunk_conflict *)local_a8,L'\0',wVar14,L'\0',false);
      local_70 = loc(wVar14,0);
      iVar17 = (int)local_88 + -1;
      local_b0.x = iVar17;
      wVar7 = (wchar_t)local_78;
      lVar9 = loc(iVar17,wVar7 + L'\xffffffff');
      find_empty_range((chunk_conflict *)pcVar11,(loc_conflict *)&local_e0,local_70,lVar9);
      local_58[1] = local_e0;
      chunk_copy((chunk_conflict *)pcVar11,p,(chunk_conflict *)c,wVar7,wVar14,local_98,false);
      wVar7 = local_94;
      chunk_copy((chunk_conflict *)pcVar11,p,(chunk_conflict *)local_a0,local_94,wVar14,L'\0',false)
      ;
      lVar9 = loc(wVar14,wVar7);
      lVar12 = loc(local_b0.x,z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)pcVar11,(loc_conflict *)&local_e0,lVar9,lVar12);
      local_58[3] = local_e0;
      wVar14 = (wchar_t)local_88;
      chunk_copy((chunk_conflict *)pcVar11,p,(chunk_conflict *)local_d8,L'\0',wVar14,L'\0',false);
      lVar9 = loc(wVar14,0);
      lVar12 = loc(z_info->dungeon_wid - 1,z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)pcVar11,(loc_conflict *)&local_e0,lVar9,lVar12);
      local_58[2] = local_e0;
      draw_rectangle(pcVar11,L'\0',L'\0',pcVar11->height + L'\xffffffff',
                     pcVar11->width + L'\xffffffff',FEAT_PERM,L'\0',true);
      len = (long)pcVar11->width * (long)pcVar11->height * 4;
      colors = (int *)mem_zalloc(len);
      counts = (int *)mem_zalloc(len);
      build_colors(pcVar11,colors,counts,(_Bool *)0x0,true);
      do {
        wVar14 = grid_to_i((loc_conflict)local_58[lVar19],pcVar11->width);
        local_c8[lVar19] = colors[wVar14];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      join_region(pcVar11,colors,counts,local_c8[0],local_c8[1],false);
      join_region(pcVar11,colors,counts,local_c8[2],local_c8[3],false);
      lVar19 = 1;
      do {
        wVar14 = grid_to_i((loc_conflict)local_58[lVar19],pcVar11->width);
        local_c8[lVar19] = colors[wVar14];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      join_region(pcVar11,colors,counts,local_c8[1],local_c8[2],false);
      mem_free(colors);
      mem_free(counts);
      ensure_connectedness(pcVar11,false);
      cave_free((chunk_conflict *)local_68);
      cave_free((chunk_conflict *)local_a8);
      cave_free((chunk_conflict *)c);
      cave_free((chunk_conflict *)local_a0);
      cave_free((chunk_conflict *)local_d8);
      wVar14 = FEAT_MORE;
      iVar13 = local_90 + (int)local_80;
      uVar1 = z_info->dungeon_hgt;
      iVar15 = (local_8c + (int)local_78) * (int)local_60;
      wVar7 = rand_range(1,3);
      alloc_stairs((chunk_conflict *)pcVar11,wVar14,wVar7,L'\0',false,(connector *)0x0);
      wVar14 = FEAT_LESS;
      wVar7 = rand_range(1,2);
      alloc_stairs((chunk_conflict *)pcVar11,wVar14,wVar7,L'\0',false,(connector *)0x0);
      wVar14 = pcVar11->depth;
      iVar17 = (uint)(L'\x05' < wVar14) * 8 + 2;
      if (0xffffffe4 < (uint)(wVar14 + L'\xffffffdf')) {
        iVar17 = wVar14 / 3;
      }
      uVar2 = (long)(int)(iVar17 * (iVar15 + (uint)uVar1 * iVar13)) /
              (long)(int)((uint)z_info->dungeon_wid * (uint)z_info->dungeon_hgt);
      uVar6 = (uint32_t)uVar2;
      uVar8 = Rand_div(uVar6);
      alloc_objects((chunk_conflict *)pcVar11,L'\x03',L'\0',uVar8 + L'\x01',pcVar11->depth,'\0');
      uVar8 = Rand_div(uVar6);
      alloc_objects((chunk_conflict *)pcVar11,L'\x01',L'\x01',uVar8 + L'\x01',pcVar11->depth,'\0');
      _Var4 = new_player_spot((chunk_conflict *)pcVar11,p);
      if (_Var4) {
        uVar8 = Rand_div(8);
        if (0 < (int)(uVar6 + uVar8 + 1)) {
          iVar17 = uVar8 + uVar6 + 2;
          do {
            to_avoid.x = (p->grid).x;
            to_avoid.y = (p->grid).y;
            pick_and_place_distant_monster(pcVar11,to_avoid,L'\0',true,pcVar11->depth);
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        iVar5 = Rand_normal(uVar6,2);
        alloc_objects((chunk_conflict *)pcVar11,L'\x03',L'\x03',(int)iVar5,pcVar11->depth + L'\x05',
                      '\a');
        iVar5 = Rand_normal((int)(((uint)(uVar2 >> 0x1f) & 1) + uVar6) >> 1,2);
        alloc_objects((chunk_conflict *)pcVar11,L'\x03',L'\x02',(int)iVar5,pcVar11->depth,'\a');
        uVar8 = uVar6 + 3;
        if (-1 < (int)uVar6) {
          uVar8 = uVar6;
        }
        wVar14 = Rand_div((int)uVar8 >> 2);
        alloc_objects((chunk_conflict *)pcVar11,L'\x03',L'\x04',wVar14,pcVar11->depth,'\a');
        return pcVar11;
      }
      uncreate_artifacts((chunk_conflict *)pcVar11);
      wipe_mon_list(pcVar11,p);
      cave_free((chunk_conflict *)pcVar11);
      pcVar18 = "could not place player";
LAB_0014d9fa:
      *local_d0 = pcVar18;
    }
  }
  return (chunk *)0x0;
}

Assistant:

struct chunk *hard_centre_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	/* Make a vault for the centre */
	struct chunk *centre = vault_chunk(p);
	int rotate = 0;

	/* Dimensions for the surrounding caverns */
	int centre_cavern_ypos;
	int centre_cavern_hgt, centre_cavern_wid;
	int upper_cavern_hgt, lower_cavern_hgt;
	struct chunk *upper_cavern;
	struct chunk *lower_cavern;
	int lower_cavern_ypos;
	int left_cavern_wid, right_cavern_wid;
	struct chunk *left_cavern;
	struct chunk *right_cavern;
	struct chunk *c;
	int i, k, cavern_area;
	struct loc grid;
	struct loc floor[4];

	/* No persistent levels of this type for now */
	if (dun->persist) {
		uncreate_artifacts(centre);
		wipe_mon_list(centre, p);
		cave_free(centre);
		*p_error = "no hard centre levels in persistent dungeons";
		return NULL;
	}

	/*
	 * Carve out entrances to the vault.  Only use one if there aren't
	 * explicitly marked entrances since those vaults typically have empty
	 * space about them and the extra entrances aren't useful.
	 */
	k = 1 + ((dun->ent_n[0] > 0) ? randint1(3) : 0);
	dun->wall_n = 0;
	for (i = 0; i < k; ++i) {
		if (dun->ent_n[0] == 0) {
			/*
			 * There's no explicitly marked entrances.  Look for a
			 * square marked SQUARE_WALL_OUTER.
			 */
			if (!cave_find(centre, &grid, square_iswall_outer)) {
				if (i == 0) {
					uncreate_artifacts(centre);
					wipe_mon_list(centre, p);
					cave_free(centre);
					*p_error = "no SQUARE_WALL_OUTER grid for an entrance to the centre vault";
					return NULL;
				}
				break;
			}
		} else {
			grid = choose_random_entrance(centre, 0, NULL, 0,
				dun->wall, i);
			if (loc_eq(grid, loc(0, 0))) {
				if (i == 0) {
					uncreate_artifacts(centre);
					wipe_mon_list(centre, p);
					cave_free(centre);
					*p_error = "random selection of entrance to the centre vault failed";
					return NULL;
				}
				break;
			}
		}
		/*
		 * Store position in dun->wall and mark neighbors as invalid
		 * entrances.
		 */
		pierce_outer_wall(centre, grid);
		/* Convert it to a floor. */
		square_set_feat(centre, grid, FEAT_FLOOR);
	}

	/* Measure the vault, rotate to make it wider than it is high */
	if (centre->height > centre->width) {
		rotate = 1;
		centre_cavern_ypos = (z_info->dungeon_hgt - centre->width) / 2;
		centre_cavern_hgt = centre->width;
		centre_cavern_wid = centre->height;
	} else {
		centre_cavern_ypos = (z_info->dungeon_hgt - centre->height) / 2;
		centre_cavern_hgt = centre->height;
		centre_cavern_wid = centre->width;
	}
	upper_cavern_hgt = centre_cavern_ypos;
	lower_cavern_hgt = z_info->dungeon_hgt - upper_cavern_hgt -
		centre_cavern_hgt;
	lower_cavern_ypos = centre_cavern_ypos + centre_cavern_hgt;

	/* Make the caverns */
	upper_cavern = cavern_chunk(p, upper_cavern_hgt, centre_cavern_wid, NULL);
	lower_cavern = cavern_chunk(p, lower_cavern_hgt, centre_cavern_wid, NULL);
	left_cavern_wid = (z_info->dungeon_wid - centre_cavern_wid) / 2;
	right_cavern_wid = z_info->dungeon_wid - left_cavern_wid -
		centre_cavern_wid;
	left_cavern = cavern_chunk(p, z_info->dungeon_hgt, left_cavern_wid, NULL);
	right_cavern = cavern_chunk(p, z_info->dungeon_hgt, right_cavern_wid, NULL);

	/* Return on failure */
	if (!upper_cavern || !lower_cavern || !left_cavern || !right_cavern) {
		if (right_cavern) {
			uncreate_artifacts(right_cavern);
			cave_free(right_cavern);
		}
		if (left_cavern) {
			uncreate_artifacts(left_cavern);
			cave_free(left_cavern);
		}
		if (lower_cavern) {
			uncreate_artifacts(lower_cavern);
			cave_free(lower_cavern);
		}
		if (upper_cavern) {
			uncreate_artifacts(upper_cavern);
			cave_free(upper_cavern);
		}
		uncreate_artifacts(centre);
		wipe_mon_list(centre, p);
		cave_free(centre);
		*p_error = "could not create one or more of the surrounding caverns";
		return NULL;
	}

	/* Make a cave to copy them into, and find a floor square in each cavern */
	c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Left */
	chunk_copy(c, p, left_cavern, 0, 0, 0, false);
	find_empty_range(c, &grid, loc(0, 0),
					 loc(left_cavern_wid - 1, z_info->dungeon_hgt - 1));
	floor[0] = grid;

	/* Upper */
	chunk_copy(c, p, upper_cavern, 0, left_cavern_wid, 0, false);
	find_empty_range(c, &grid, loc(left_cavern_wid, 0),
					 loc(left_cavern_wid + centre_cavern_wid - 1,
						 upper_cavern_hgt - 1));
	floor[1] = grid;

	/* Centre */
	chunk_copy(c, p, centre, centre_cavern_ypos, left_cavern_wid, rotate, false);

	/* Lower */
	chunk_copy(c, p, lower_cavern, lower_cavern_ypos, left_cavern_wid, 0, false);
	find_empty_range(c, &grid, loc(left_cavern_wid, lower_cavern_ypos),
					 loc(left_cavern_wid + centre_cavern_wid - 1,
						 z_info->dungeon_hgt - 1));
	floor[3] = grid;

	/* Right */
	chunk_copy(c, p, right_cavern, 0, left_cavern_wid + centre_cavern_wid, 0,
		false);
	find_empty_range(c, &grid, loc(left_cavern_wid + centre_cavern_wid, 0),
		loc(z_info->dungeon_wid - 1, z_info->dungeon_hgt - 1));
	floor[2] = grid;

	/* Encase in perma-rock */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect up all the caverns */
	connect_caverns(c, floor);

	/* Connect to the centre entrances. */
	ensure_connectedness(c, false);

	/* Free all the chunks */
	cave_free(left_cavern);
	cave_free(upper_cavern);
	cave_free(centre);
	cave_free(lower_cavern);
	cave_free(right_cavern);

	cavern_area = (left_cavern_wid + right_cavern_wid) * z_info->dungeon_hgt +
		centre_cavern_wid * (upper_cavern_hgt + lower_cavern_hgt);

	/* Place 2-3 down stairs near some walls */
	alloc_stairs(c, FEAT_MORE, rand_range(1, 3), 0, false, NULL);

	/* Place 1-2 up stairs near some walls */
	alloc_stairs(c, FEAT_LESS, rand_range(1, 2), 0, false, NULL);

	/* Generate some rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Scale number by total cavern size - caverns are fairly sparse */
	k = (k * cavern_area) / (z_info->dungeon_hgt * z_info->dungeon_wid);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_BOTH, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Put some monsters in the dungeon */
	for (i = randint1(8) + k; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(k, 2), c->depth + 5,
		ORIGIN_CAVERN);
	alloc_objects(c, SET_BOTH, TYP_GOLD, Rand_normal(k / 2, 2), c->depth,
		ORIGIN_CAVERN);
	alloc_objects(c, SET_BOTH, TYP_GOOD, randint0(k / 4), c->depth,
		ORIGIN_CAVERN);

	return c;
}